

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O0

void __thiscall temp_box::collect(temp_box *this,cf_face *face,cf_vertex_vec *verts)

{
  long lVar1;
  bool bVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  _vector3<float> *p_Var5;
  ulong uVar6;
  float fVar7;
  _vector3<float> local_5c;
  long local_50;
  uint_fast32_t i;
  fvector3 edge [2];
  ulong local_28;
  uint_fast32_t k;
  cf_vertex_vec *verts_local;
  cf_face *face_local;
  temp_box *this_local;
  
  if ((uint)this->inner != (face->field_1).dummy >> 0x10) {
    __assert_fail("inner == face.sector",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sound_envs.cxx"
                  ,0x36,"void temp_box::collect(const cf_face &, const cf_vertex_vec &)");
  }
  if ((uint)this->outer == ((face->field_1).dummy & 0x3fff)) {
    if (this->state != 1) {
      local_28 = 3;
      uVar6 = local_28;
      do {
        local_28 = uVar6;
        if (local_28 == 0) {
          return;
        }
        uVar6 = local_28 - 1;
      } while (*(uint32_t *)((long)face + local_28 * 4 + -4) != this->base_idx);
      pvVar3 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::operator[]
                         (verts,(ulong)*(uint *)((long)&face->field_0 + (local_28 % 3) * 4));
      pvVar4 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::operator[]
                         (verts,(ulong)*(uint *)((long)face + uVar6 * 4));
      xray_re::_vector3<float>::sub((_vector3<float> *)&i,&pvVar3->p,&pvVar4->p);
      pvVar3 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::operator[]
                         (verts,(ulong)*(uint *)((long)&face->field_0 + ((local_28 + 1) % 3) * 4));
      pvVar4 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::operator[]
                         (verts,(ulong)*(uint *)((long)face + uVar6 * 4));
      xray_re::_vector3<float>::sub
                ((_vector3<float> *)((long)&edge[0].field_0 + 4),&pvVar3->p,&pvVar4->p);
      local_50 = 2;
      do {
        do {
          if (local_50 == 0) {
            return;
          }
          lVar1 = local_50 + -2;
          local_50 = local_50 + -1;
          fVar7 = xray_re::_vector3<float>::cosine
                            ((_vector3<float> *)&this->xform,
                             (_vector3<float> *)((long)&edge[lVar1].field_0 + 4));
          bVar2 = xray_re::equivalent<float>(fVar7,0.0,0.001);
        } while (!bVar2);
        fVar7 = xray_re::_vector3<float>::cosine
                          (&(this->xform).field_0.field_1.j,
                           (_vector3<float> *)((long)&edge[local_50 + -1].field_0 + 4));
        bVar2 = xray_re::equivalent<float>(fVar7,0.0,0.001);
      } while (!bVar2);
      xray_re::_vector3<float>::set<float>
                (&(this->xform).field_0.field_1.k,
                 (_vector3<float> *)((long)&edge[local_50 + -1].field_0 + 4));
      this->state = 1;
      memset(&local_5c,0,0xc);
      p_Var5 = xray_re::_vector3<float>::add
                         (&local_5c,(_vector3<float> *)&this->xform,&(this->xform).field_0.field_1.j
                         );
      p_Var5 = xray_re::_vector3<float>::add(p_Var5,&(this->xform).field_0.field_1.k);
      p_Var5 = xray_re::_vector3<float>::mul(p_Var5,0.5);
      xray_re::_vector3<float>::add(&(this->xform).field_0.field_1.c,p_Var5);
    }
    return;
  }
  __assert_fail("outer == face.material",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sound_envs.cxx"
                ,0x37,"void temp_box::collect(const cf_face &, const cf_vertex_vec &)");
}

Assistant:

void temp_box::collect(const cf_face& face, const cf_vertex_vec& verts)
{
	// FIXME: this code will not work in a (legal) situation with intersecting
	// sound volumes. So far I am not aware of any real examples, though.
	xr_assert(inner == face.sector);
	xr_assert(outer == face.material);
	if (state == STATE_DONE)
		return;
	for (uint_fast32_t k = 3; k != 0;) {
		if (face.v[--k] != base_idx)
			continue;
		fvector3 edge[2];
		edge[0].sub(verts[face.v[(k+1)%3]].p, verts[face.v[k]].p);
		edge[1].sub(verts[face.v[(k+2)%3]].p, verts[face.v[k]].p);
		for (uint_fast32_t i = 2; i != 0;) {
			--i;
			if (equivalent(xform.i.cosine(edge[i]), 0.f, k_zero_tolerance) &&
					equivalent(xform.j.cosine(edge[i]), 0.f, k_zero_tolerance)) {
				xform.k.set(edge[i]);
				state = STATE_DONE;
				xform.c.add(fvector3().add(xform.i, xform.j).add(xform.k).mul(0.5f));
				return;
			}
		}
		break;
	}
}